

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  undefined1 (*pauVar2) [12];
  uint *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  parasail_result_t *ppVar15;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  __m128i *palVar21;
  __m128i *palVar22;
  __m128i *palVar23;
  __m128i *palVar24;
  uint uVar25;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong uVar44;
  int iVar45;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar51;
  uint uVar55;
  uint uVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar57;
  undefined1 auVar54 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar58 [16];
  uint uVar59;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [16];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  uint uVar71;
  undefined1 auVar69 [16];
  uint uVar72;
  uint uVar73;
  undefined1 auVar70 [16];
  int iVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  int iVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar91;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_32_t h;
  undefined1 local_228 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  long local_190;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar14 = profile->s1Len;
        if ((int)uVar14 < 1) {
          parasail_nw_stats_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse41_128_32_cold_4();
        }
        else {
          uVar34 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_32_cold_1();
          }
          else {
            local_228._0_4_ = gap;
            iVar28 = uVar14 - 1;
            uVar36 = (ulong)uVar14 + 3 >> 2;
            iVar35 = (int)uVar36;
            uVar33 = iVar28 % iVar35;
            iVar30 = -open;
            iVar45 = ppVar5->min;
            uVar18 = 0x80000000 - iVar45;
            if (iVar45 != iVar30 && SBORROW4(iVar45,iVar30) == iVar45 + open < 0) {
              uVar18 = open | 0x80000000;
            }
            local_1e8._0_4_ = uVar18;
            pvVar6 = (profile->profile32).matches;
            uVar10 = 0x7ffffffe - ppVar5->max;
            pvVar7 = (profile->profile32).similar;
            ppVar15 = parasail_result_new_table3((uint)((ulong)uVar14 + 3) & 0x7ffffffc,s2Len);
            if (ppVar15 != (parasail_result_t *)0x0) {
              ppVar15->flag = ppVar15->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,uVar36);
              b_00 = parasail_memalign___m128i(0x10,uVar36);
              b_01 = parasail_memalign___m128i(0x10,uVar36);
              b_02 = parasail_memalign___m128i(0x10,uVar36);
              ptr = parasail_memalign___m128i(0x10,uVar36);
              b_03 = parasail_memalign___m128i(0x10,uVar36);
              b_04 = parasail_memalign___m128i(0x10,uVar36);
              b_05 = parasail_memalign___m128i(0x10,uVar36);
              ptr_00 = parasail_memalign___m128i(0x10,uVar36);
              ptr_01 = parasail_memalign___m128i(0x10,uVar36);
              ptr_02 = parasail_memalign___m128i(0x10,uVar36);
              ptr_03 = parasail_memalign___m128i(0x10,uVar36);
              ptr_04 = parasail_memalign___m128i(0x10,uVar36);
              ptr_05 = parasail_memalign___m128i(0x10,uVar36);
              ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (ptr_02 == (__m128i *)0x0 ||
                           (ptr_01 == (__m128i *)0x0 ||
                           (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0))) ||
                           ((b_04 == (__m128i *)0x0 ||
                            (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                           ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                           (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
              if ((ptr_06 != (int32_t *)0x0 &&
                  (ptr_05 != (__m128i *)0x0 &&
                  (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))) &&
                  ((ptr_02 != (__m128i *)0x0 &&
                   (ptr_01 != (__m128i *)0x0 && (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0)
                   )) && ((b_04 != (__m128i *)0x0 &&
                          (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) &&
                         ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                         (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
                iVar11 = s2Len + -1;
                iVar12 = 3 - iVar28 / iVar35;
                uVar18 = uVar18 + 1;
                iVar13 = -(iVar35 * gap);
                c[0] = uVar36;
                uVar20 = uVar36;
                parasail_memset___m128i(b_03,c,uVar36);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar36;
                parasail_memset___m128i(b_04,c_00,uVar20);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar36;
                parasail_memset___m128i(b_05,c_01,uVar20);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar36;
                parasail_memset___m128i(b,c_02,uVar20);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar36;
                parasail_memset___m128i(b_00,c_03,uVar20);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar36;
                parasail_memset___m128i(b_01,c_04,uVar20);
                c_05[1] = extraout_RDX_05;
                c_05[0] = uVar36;
                parasail_memset___m128i(b_02,c_05,uVar20);
                iVar45 = -open;
                iVar48 = -open;
                iVar49 = -open;
                iVar50 = -open;
                uVar14 = iVar35 - 1;
                lVar19 = (ulong)uVar14 << 4;
                auVar38 = pmovsxbd(extraout_XMM0,0x1010101);
                uVar20 = uVar36;
                do {
                  piVar1 = (int *)((long)*ptr_04 + lVar19);
                  *piVar1 = iVar45;
                  piVar1[1] = iVar48;
                  piVar1[2] = iVar49;
                  piVar1[3] = iVar50;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar19) = auVar38;
                  iVar45 = iVar45 - gap;
                  iVar48 = iVar48 - gap;
                  iVar49 = iVar49 - gap;
                  iVar50 = iVar50 - gap;
                  auVar69._0_4_ = auVar38._0_4_ + 1;
                  auVar69._4_4_ = auVar38._4_4_ + 1;
                  auVar69._8_4_ = auVar38._8_4_ + 1;
                  auVar69._12_4_ = auVar38._12_4_ + 1;
                  lVar19 = lVar19 + -0x10;
                  iVar68 = (int)uVar20;
                  uVar25 = iVar68 - 1;
                  uVar20 = (ulong)uVar25;
                  auVar38 = auVar69;
                } while (uVar25 != 0 && 0 < iVar68);
                uVar20 = 0;
                iVar45 = iVar30;
                do {
                  lVar19 = 0;
                  iVar48 = iVar45;
                  do {
                    *(int *)((long)&local_48 + lVar19 * 4) = iVar48;
                    lVar19 = lVar19 + 1;
                    iVar48 = iVar48 - iVar35 * gap;
                  } while (lVar19 != 4);
                  ptr[uVar20][0] = local_48;
                  ptr[uVar20][1] = lStack_40;
                  uVar20 = uVar20 + 1;
                  iVar45 = iVar45 - gap;
                } while (uVar20 != uVar36);
                *ptr_06 = 0;
                uVar20 = 1;
                do {
                  ptr_06[uVar20] = iVar30;
                  uVar20 = uVar20 + 1;
                  iVar30 = iVar30 - gap;
                } while (s2Len + 1 != uVar20);
                palVar21 = ptr + uVar14;
                palVar22 = b_03 + uVar14;
                palVar23 = b_04 + uVar14;
                palVar24 = b_05 + uVar14;
                uVar20 = 1;
                if (1 < s2Len) {
                  uVar20 = uVar34;
                }
                lVar29 = (ulong)(iVar35 + (uint)(iVar35 == 0)) << 4;
                lVar31 = uVar36 * uVar34;
                lVar19 = lVar31 * 4;
                lVar32 = lVar31 * 8;
                lVar31 = lVar31 * 0xc;
                local_190 = 0;
                uVar27 = 0;
                uVar14 = uVar18;
                uVar25 = uVar18;
                uVar71 = uVar18;
                uVar72 = uVar18;
                uVar75 = uVar10;
                uVar77 = uVar10;
                uVar79 = uVar10;
                uVar81 = uVar10;
                do {
                  iStack_144 = (int)(*palVar22)[0];
                  iStack_140 = *(int *)((long)*palVar22 + 4);
                  iStack_13c = (int)(*palVar22)[1];
                  iStack_174 = (int)(*palVar23)[0];
                  iStack_170 = *(int *)((long)*palVar23 + 4);
                  iStack_16c = (int)(*palVar23)[1];
                  iStack_154 = (int)(*palVar24)[0];
                  iStack_150 = *(int *)((long)*palVar24 + 4);
                  iStack_14c = (int)(*palVar24)[1];
                  local_148 = 0;
                  local_178 = 0;
                  local_158 = 0;
                  lVar26 = (long)ppVar5->mapper[(byte)s2[uVar27]] * uVar36 * 0x10;
                  uVar64 = uVar18 - (int)(*ptr_04)[0];
                  uVar65 = uVar18 - *(int *)((long)*ptr_04 + 4);
                  uVar66 = uVar18 - (int)(*ptr_04)[1];
                  uVar67 = uVar18 - *(int *)((long)*ptr_04 + 0xc);
                  auVar96 = ZEXT816(0);
                  lVar16 = 0;
                  local_1f8 = ZEXT816(0);
                  local_1d8 = ZEXT816(0);
                  auVar38 = in_XMM4;
                  auVar69 = local_1e8;
                  uVar59 = uVar18;
                  uVar61 = uVar18;
                  uVar62 = uVar18;
                  uVar63 = uVar18;
                  local_1e8._0_4_ = ptr_06[uVar27];
                  local_1e8._4_4_ = (int)(*palVar21)[0];
                  local_1e8._8_4_ = *(int *)((long)*palVar21 + 4);
                  iVar45 = (int)(*palVar21)[1];
                  do {
                    pauVar2 = (undefined1 (*) [12])((long)*ptr + lVar16);
                    auVar9 = *pauVar2;
                    iVar30 = *(int *)pauVar2[1];
                    auVar40 = *(undefined1 (*) [16])((long)*b_03 + lVar16);
                    piVar1 = (int *)((long)*b + lVar16);
                    iVar91 = *(int *)*pauVar2 - open;
                    iVar93 = *(int *)(*pauVar2 + 4) - open;
                    iVar94 = *(int *)(*pauVar2 + 8) - open;
                    iVar95 = iVar30 - open;
                    iVar74 = *piVar1 - gap;
                    iVar76 = piVar1[1] - gap;
                    iVar78 = piVar1[2] - gap;
                    iVar80 = piVar1[3] - gap;
                    auVar82._0_4_ = -(uint)(iVar74 < iVar91);
                    auVar82._4_4_ = -(uint)(iVar76 < iVar93);
                    auVar82._8_4_ = -(uint)(iVar78 < iVar94);
                    auVar82._12_4_ = -(uint)(iVar80 < iVar95);
                    auVar46 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar16),auVar40,auVar82)
                    ;
                    auVar53 = *(undefined1 (*) [16])((long)*b_04 + lVar16);
                    auVar97 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar16),auVar53,auVar82)
                    ;
                    auVar88 = *(undefined1 (*) [16])((long)*b_05 + lVar16);
                    auVar82 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar16),auVar88,auVar82)
                    ;
                    piVar1 = (int *)((long)*ptr_04 + lVar16);
                    iVar48 = uVar64 + *piVar1;
                    iVar49 = uVar65 + piVar1[1];
                    iVar50 = uVar66 + piVar1[2];
                    iVar68 = uVar67 + piVar1[3];
                    auVar39._0_4_ = -(uint)((int)uVar59 < iVar48);
                    auVar39._4_4_ = -(uint)((int)uVar61 < iVar49);
                    auVar39._8_4_ = -(uint)((int)uVar62 < iVar50);
                    auVar39._12_4_ = -(uint)((int)uVar63 < iVar68);
                    local_1d8 = blendvps(local_1d8,local_228,auVar39);
                    local_1f8 = blendvps(local_1f8,auVar69,auVar39);
                    uVar64 = (uint)(iVar74 < iVar91) * iVar91 | (uint)(iVar74 >= iVar91) * iVar74;
                    uVar65 = (uint)(iVar76 < iVar93) * iVar93 | (uint)(iVar76 >= iVar93) * iVar76;
                    uVar66 = (uint)(iVar78 < iVar94) * iVar94 | (uint)(iVar78 >= iVar94) * iVar78;
                    uVar67 = (uint)(iVar80 < iVar95) * iVar95 | (uint)(iVar80 >= iVar95) * iVar80;
                    uVar59 = (iVar48 < (int)uVar59) * uVar59 |
                             (uint)(iVar48 >= (int)uVar59) * iVar48;
                    uVar61 = (iVar49 < (int)uVar61) * uVar61 |
                             (uint)(iVar49 >= (int)uVar61) * iVar49;
                    uVar62 = (iVar50 < (int)uVar62) * uVar62 |
                             (uint)(iVar50 >= (int)uVar62) * iVar50;
                    uVar63 = (iVar68 < (int)uVar63) * uVar63 |
                             (uint)(iVar68 >= (int)uVar63) * iVar68;
                    piVar1 = (int *)((long)*ptr_05 + lVar16);
                    auVar58._0_4_ = auVar38._0_4_ + *piVar1;
                    auVar58._4_4_ = auVar38._4_4_ + piVar1[1];
                    auVar58._8_4_ = auVar38._8_4_ + piVar1[2];
                    auVar58._12_4_ = auVar38._12_4_ + piVar1[3];
                    auVar96 = blendvps(auVar96,auVar58,auVar39);
                    piVar1 = (int *)((long)pvVar4 + lVar16 + lVar26);
                    iVar48 = local_1e8._0_4_ + *piVar1;
                    local_1e8._4_4_ = local_1e8._4_4_ + piVar1[1];
                    local_1e8._8_4_ = local_1e8._8_4_ + piVar1[2];
                    iVar45 = iVar45 + piVar1[3];
                    piVar1 = (int *)((long)pvVar6 + lVar16 + lVar26);
                    auVar84._0_4_ = local_148 + *piVar1;
                    auVar84._4_4_ = iStack_144 + piVar1[1];
                    auVar84._8_4_ = iStack_140 + piVar1[2];
                    auVar84._12_4_ = iStack_13c + piVar1[3];
                    piVar1 = (int *)((long)pvVar7 + lVar16 + lVar26);
                    auVar52._0_4_ = local_178 + *piVar1;
                    auVar52._4_4_ = iStack_174 + piVar1[1];
                    auVar52._8_4_ = iStack_170 + piVar1[2];
                    auVar52._12_4_ = iStack_16c + piVar1[3];
                    auVar38._0_4_ = -(uint)(iVar48 < (int)uVar64);
                    auVar38._4_4_ = -(uint)((int)local_1e8._4_4_ < (int)uVar65);
                    auVar38._8_4_ = -(uint)((int)local_1e8._8_4_ < (int)uVar66);
                    auVar38._12_4_ = -(uint)(iVar45 < (int)uVar67);
                    local_228 = blendvps(auVar84,auVar46,auVar38);
                    auVar69 = blendvps(auVar52,auVar97,auVar38);
                    auVar83._0_4_ = auVar82._0_4_ + 1;
                    auVar83._4_4_ = auVar82._4_4_ + 1;
                    auVar83._8_4_ = auVar82._8_4_ + 1;
                    auVar83._12_4_ = auVar82._12_4_ + 1;
                    auVar42._0_4_ = local_158 + 1;
                    auVar42._4_4_ = iStack_154 + 1;
                    auVar42._8_4_ = iStack_150 + 1;
                    auVar42._12_4_ = iStack_14c + 1;
                    auVar38 = blendvps(auVar42,auVar83,auVar38);
                    puVar3 = (uint *)((long)*b + lVar16);
                    *puVar3 = uVar64;
                    puVar3[1] = uVar65;
                    puVar3[2] = uVar66;
                    puVar3[3] = uVar67;
                    *(undefined1 (*) [16])((long)*b_00 + lVar16) = auVar46;
                    *(undefined1 (*) [16])((long)*b_01 + lVar16) = auVar97;
                    *(undefined1 (*) [16])((long)*b_02 + lVar16) = auVar83;
                    uVar64 = (uint)((int)uVar64 < iVar48) * iVar48 |
                             ((int)uVar64 >= iVar48) * uVar64;
                    uVar65 = (uint)((int)uVar65 < (int)local_1e8._4_4_) * local_1e8._4_4_ |
                             ((int)uVar65 >= (int)local_1e8._4_4_) * uVar65;
                    uVar66 = (uint)((int)uVar66 < (int)local_1e8._8_4_) * local_1e8._8_4_ |
                             ((int)uVar66 >= (int)local_1e8._8_4_) * uVar66;
                    uVar67 = (uint)((int)uVar67 < iVar45) * iVar45 |
                             ((int)uVar67 >= iVar45) * uVar67;
                    piVar1 = (int *)((long)*ptr + lVar16);
                    *piVar1 = iVar48;
                    piVar1[1] = local_1e8._4_4_;
                    piVar1[2] = local_1e8._8_4_;
                    piVar1[3] = iVar45;
                    *(undefined1 (*) [16])((long)*b_03 + lVar16) = auVar84;
                    *(undefined1 (*) [16])((long)*b_04 + lVar16) = auVar52;
                    *(undefined1 (*) [16])((long)*b_05 + lVar16) = auVar42;
                    lVar16 = lVar16 + 0x10;
                    local_158 = auVar88._0_4_;
                    iStack_154 = auVar88._4_4_;
                    iStack_150 = auVar88._8_4_;
                    iStack_14c = auVar88._12_4_;
                    local_178 = auVar53._0_4_;
                    iStack_174 = auVar53._4_4_;
                    iStack_170 = auVar53._8_4_;
                    iStack_16c = auVar53._12_4_;
                    local_148 = auVar40._0_4_;
                    iStack_144 = auVar40._4_4_;
                    iStack_140 = auVar40._8_4_;
                    iStack_13c = auVar40._12_4_;
                    local_1e8._0_4_ = auVar9._0_4_;
                    local_1e8._4_4_ = auVar9._4_4_;
                    local_1e8._8_4_ = auVar9._8_4_;
                    iVar45 = iVar30;
                  } while (lVar29 != lVar16);
                  lVar16 = local_228._8_8_;
                  uVar87 = local_228._0_8_;
                  local_228._0_8_ = uVar87 << 0x20;
                  local_228._8_8_ = lVar16 << 0x20 | uVar87 >> 0x20;
                  local_1e8._0_8_ = auVar69._0_8_ << 0x20;
                  local_1e8._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                  iVar45 = ptr_06[uVar27 + 1];
                  in_XMM4._0_8_ = auVar38._0_8_ << 0x20;
                  in_XMM4._8_8_ = auVar38._8_8_ << 0x20 | auVar38._0_8_ >> 0x20;
                  uVar27 = uVar27 + 1;
                  iVar30 = (int)(*ptr_04)[0] + iVar45;
                  iVar48 = *(int *)((long)*ptr_04 + 4) + uVar64;
                  iVar49 = (int)(*ptr_04)[1] + uVar65;
                  iVar50 = *(int *)((long)*ptr_04 + 0xc) + uVar66;
                  auVar40._0_4_ = -(uint)(iVar30 < (int)uVar59);
                  auVar40._4_4_ = -(uint)(iVar48 < (int)uVar61);
                  auVar40._8_4_ = -(uint)(iVar49 < (int)uVar62);
                  auVar40._12_4_ = -(uint)(iVar50 < (int)uVar63);
                  auVar53._0_4_ =
                       (iVar30 < (int)uVar59) * uVar59 | (uint)(iVar30 >= (int)uVar59) * iVar30;
                  auVar53._4_4_ =
                       (iVar48 < (int)uVar61) * uVar61 | (uint)(iVar48 >= (int)uVar61) * iVar48;
                  auVar53._8_4_ =
                       (iVar49 < (int)uVar62) * uVar62 | (uint)(iVar49 >= (int)uVar62) * iVar49;
                  auVar53._12_4_ =
                       (iVar50 < (int)uVar63) * uVar63 | (uint)(iVar50 >= (int)uVar63) * iVar50;
                  auVar69 = blendvps(local_228,local_1d8,auVar40);
                  auVar88 = blendvps(local_1e8,local_1f8,auVar40);
                  auVar46._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar38._0_4_;
                  auVar46._0_4_ = (int)(*ptr_05)[0];
                  auVar46._8_4_ = (int)(*ptr_05)[1] + auVar38._4_4_;
                  auVar46._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar38._8_4_;
                  auVar38 = blendvps(auVar46,auVar96,auVar40);
                  iVar30 = 1;
                  do {
                    auVar85._0_8_ = auVar69._0_8_ << 0x20;
                    auVar85._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                    iVar49 = auVar53._0_4_;
                    iVar50 = iVar49 + iVar13;
                    iVar74 = auVar53._4_4_;
                    iVar76 = auVar53._8_4_;
                    iVar68 = iVar74 + iVar13;
                    iVar78 = iVar76 + iVar13;
                    auVar97._0_4_ = -(uint)((int)uVar18 < iVar49);
                    auVar97._4_4_ = -(uint)(iVar50 < iVar74);
                    iVar48 = auVar53._12_4_;
                    auVar97._8_4_ = -(uint)(iVar68 < iVar76);
                    auVar97._12_4_ = -(uint)(iVar78 < iVar48);
                    auVar69 = blendvps(auVar85,auVar69,auVar97);
                    auVar89._0_8_ = auVar88._0_8_ << 0x20;
                    auVar89._8_8_ = auVar88._8_8_ << 0x20 | auVar88._0_8_ >> 0x20;
                    auVar96._4_4_ = auVar38._4_4_ + iVar35;
                    auVar96._0_4_ = auVar38._0_4_ + iVar35;
                    auVar96._8_4_ = auVar38._8_4_ + iVar35;
                    auVar96._12_4_ = 0;
                    auVar88 = blendvps(auVar89,auVar88,auVar97);
                    auVar53._0_4_ =
                         (uint)((int)uVar18 < iVar49) * iVar49 | ((int)uVar18 >= iVar49) * uVar18;
                    auVar53._4_4_ =
                         (uint)(iVar50 < iVar74) * iVar74 | (uint)(iVar50 >= iVar74) * iVar50;
                    auVar53._8_4_ =
                         (uint)(iVar68 < iVar76) * iVar76 | (uint)(iVar68 >= iVar76) * iVar68;
                    auVar53._12_4_ =
                         (uint)(iVar78 < iVar48) * iVar48 | (uint)(iVar78 >= iVar48) * iVar78;
                    auVar38 = blendvps(auVar96 << 0x20,auVar38,auVar97);
                    iVar30 = iVar30 + -1;
                  } while (iVar30 == 0);
                  auVar86._0_8_ = auVar69._0_8_ << 0x20;
                  auVar86._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                  auVar90._0_8_ = auVar88._0_8_ << 0x20;
                  auVar90._8_8_ = auVar88._8_8_ << 0x20 | auVar88._0_8_ >> 0x20;
                  auVar92._0_8_ = auVar38._0_8_ << 0x20;
                  auVar92._8_8_ = auVar38._8_8_ << 0x20 | auVar38._0_8_ >> 0x20;
                  auVar88._0_4_ = -(uint)(iVar45 < (int)uVar18);
                  auVar88._4_4_ = -(uint)((int)uVar64 < (int)auVar53._0_4_);
                  auVar88._8_4_ = -(uint)((int)uVar65 < (int)auVar53._4_4_);
                  auVar88._12_4_ = -(uint)((int)uVar66 < (int)auVar53._8_4_);
                  uVar61 = (iVar45 < (int)uVar18) * uVar18 | (uint)(iVar45 >= (int)uVar18) * iVar45;
                  uVar62 = ((int)uVar64 < (int)auVar53._0_4_) * auVar53._0_4_ |
                           ((int)uVar64 >= (int)auVar53._0_4_) * uVar64;
                  uVar63 = ((int)uVar65 < (int)auVar53._4_4_) * auVar53._4_4_ |
                           ((int)uVar65 >= (int)auVar53._4_4_) * uVar65;
                  uVar64 = ((int)uVar66 < (int)auVar53._8_4_) * auVar53._8_4_ |
                           ((int)uVar66 >= (int)auVar53._8_4_) * uVar66;
                  auVar38 = blendvps(local_228,auVar86,auVar88);
                  auVar69 = blendvps(local_1e8,auVar90,auVar88);
                  auVar96 = blendvps(in_XMM4,auVar92,auVar88);
                  lVar26 = 0;
                  lVar16 = local_190;
                  uVar59 = uVar18;
                  do {
                    iVar45 = uVar61 - open;
                    iVar30 = uVar62 - open;
                    iVar48 = uVar63 - open;
                    iVar49 = uVar64 - open;
                    iVar50 = uVar59 - gap;
                    iVar68 = auVar53._0_4_ - gap;
                    iVar74 = auVar53._4_4_ - gap;
                    iVar76 = auVar53._8_4_ - gap;
                    auVar43._0_4_ = -(uint)(iVar50 < iVar45);
                    auVar43._4_4_ = -(uint)(iVar68 < iVar30);
                    auVar43._8_4_ = -(uint)(iVar74 < iVar48);
                    auVar43._12_4_ = -(uint)(iVar76 < iVar49);
                    auVar86 = blendvps(auVar86,auVar38,auVar43);
                    puVar3 = (uint *)((long)*ptr + lVar26);
                    uVar65 = *puVar3;
                    uVar66 = puVar3[1];
                    uVar67 = puVar3[2];
                    uVar73 = puVar3[3];
                    auVar90 = blendvps(auVar90,auVar69,auVar43);
                    uVar59 = (uint)(iVar45 < iVar50) * iVar50 | (uint)(iVar45 >= iVar50) * iVar45;
                    auVar53._0_4_ =
                         (uint)(iVar30 < iVar68) * iVar68 | (uint)(iVar30 >= iVar68) * iVar30;
                    auVar53._4_4_ =
                         (uint)(iVar48 < iVar74) * iVar74 | (uint)(iVar48 >= iVar74) * iVar48;
                    auVar53._8_4_ =
                         (uint)(iVar49 < iVar76) * iVar76 | (uint)(iVar49 >= iVar76) * iVar49;
                    auVar96 = blendvps(auVar92,auVar96,auVar43);
                    piVar1 = (int *)((long)*b + lVar26);
                    iVar45 = *piVar1;
                    iVar30 = piVar1[1];
                    iVar48 = piVar1[2];
                    iVar49 = piVar1[3];
                    uVar51 = (iVar45 < (int)uVar65) * uVar65 |
                             (uint)(iVar45 >= (int)uVar65) * iVar45;
                    uVar55 = (iVar30 < (int)uVar66) * uVar66 |
                             (uint)(iVar30 >= (int)uVar66) * iVar30;
                    uVar56 = (iVar48 < (int)uVar67) * uVar67 |
                             (uint)(iVar48 >= (int)uVar67) * iVar48;
                    uVar57 = (iVar49 < (int)uVar73) * uVar73 |
                             (uint)(iVar49 >= (int)uVar73) * iVar49;
                    uVar61 = ((int)uVar51 < (int)uVar59) * uVar59 |
                             ((int)uVar51 >= (int)uVar59) * uVar51;
                    uVar62 = ((int)uVar55 < (int)auVar53._0_4_) * auVar53._0_4_ |
                             ((int)uVar55 >= (int)auVar53._0_4_) * uVar55;
                    uVar63 = ((int)uVar56 < (int)auVar53._4_4_) * auVar53._4_4_ |
                             ((int)uVar56 >= (int)auVar53._4_4_) * uVar56;
                    uVar64 = ((int)uVar57 < (int)auVar53._8_4_) * auVar53._8_4_ |
                             ((int)uVar57 >= (int)auVar53._8_4_) * uVar57;
                    auVar47._0_4_ = -(uint)(uVar65 == uVar61);
                    auVar47._4_4_ = -(uint)(uVar66 == uVar62);
                    auVar47._8_4_ = -(uint)(uVar67 == uVar63);
                    auVar47._12_4_ = -(uint)(uVar73 == uVar64);
                    auVar54._0_4_ = -(uint)((int)uVar59 < (int)uVar51);
                    auVar54._4_4_ = -(uint)((int)auVar53._0_4_ < (int)uVar55);
                    auVar54._8_4_ = -(uint)((int)auVar53._4_4_ < (int)uVar56);
                    auVar54._12_4_ = -(uint)((int)auVar53._8_4_ < (int)uVar57);
                    auVar38 = blendvps(auVar86,*(undefined1 (*) [16])((long)*b_00 + lVar26),auVar54)
                    ;
                    auVar38 = blendvps(auVar38,*(undefined1 (*) [16])((long)*b_03 + lVar26),auVar47)
                    ;
                    auVar69 = blendvps(auVar90,*(undefined1 (*) [16])((long)*b_01 + lVar26),auVar54)
                    ;
                    auVar69 = blendvps(auVar69,*(undefined1 (*) [16])((long)*b_04 + lVar26),auVar47)
                    ;
                    auVar92._0_4_ = auVar96._0_4_ + 1;
                    auVar92._4_4_ = auVar96._4_4_ + 1;
                    auVar92._8_4_ = auVar96._8_4_ + 1;
                    auVar92._12_4_ = auVar96._12_4_ + 1;
                    auVar96 = blendvps(auVar92,*(undefined1 (*) [16])((long)*b_02 + lVar26),auVar54)
                    ;
                    auVar96 = blendvps(auVar96,*(undefined1 (*) [16])((long)*b_05 + lVar26),auVar47)
                    ;
                    puVar3 = (uint *)((long)*ptr + lVar26);
                    *puVar3 = uVar61;
                    puVar3[1] = uVar62;
                    puVar3[2] = uVar63;
                    puVar3[3] = uVar64;
                    *(undefined1 (*) [16])((long)*b_03 + lVar26) = auVar38;
                    *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar69;
                    *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar96;
                    lVar17 = *((ppVar15->field_4).trace)->trace_del_table;
                    *(uint *)(lVar17 + lVar16) = uVar61;
                    lVar17 = lVar17 + lVar16;
                    *(uint *)(lVar19 + lVar17) = uVar62;
                    *(uint *)(lVar32 + lVar17) = uVar63;
                    *(uint *)(lVar31 + lVar17) = uVar64;
                    lVar17 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8);
                    iVar45 = auVar38._0_4_;
                    *(int *)(lVar17 + lVar16) = iVar45;
                    lVar17 = lVar17 + lVar16;
                    uVar8 = extractps(auVar38,1);
                    *(undefined8 *)(lVar19 + lVar17) = uVar8;
                    uVar8 = extractps(auVar38,2);
                    *(undefined8 *)(lVar32 + lVar17) = uVar8;
                    uVar8 = extractps(auVar38,3);
                    *(undefined8 *)(lVar31 + lVar17) = uVar8;
                    lVar17 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10);
                    iVar30 = auVar69._0_4_;
                    *(int *)(lVar17 + lVar16) = iVar30;
                    lVar17 = lVar17 + lVar16;
                    uVar8 = extractps(auVar69,1);
                    *(undefined8 *)(lVar19 + lVar17) = uVar8;
                    uVar8 = extractps(auVar69,2);
                    *(undefined8 *)(lVar32 + lVar17) = uVar8;
                    uVar8 = extractps(auVar69,3);
                    *(undefined8 *)(lVar31 + lVar17) = uVar8;
                    lVar17 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
                    iVar48 = auVar96._0_4_;
                    *(int *)(lVar17 + lVar16) = iVar48;
                    lVar17 = lVar17 + lVar16;
                    uVar8 = extractps(auVar96,1);
                    *(undefined8 *)(lVar19 + lVar17) = uVar8;
                    uVar8 = extractps(auVar96,2);
                    *(undefined8 *)(lVar32 + lVar17) = uVar8;
                    uVar8 = extractps(auVar96,3);
                    *(undefined8 *)(lVar31 + lVar17) = uVar8;
                    uVar75 = ((int)uVar61 < (int)uVar75) * uVar61 |
                             ((int)uVar61 >= (int)uVar75) * uVar75;
                    uVar77 = ((int)uVar62 < (int)uVar77) * uVar62 |
                             ((int)uVar62 >= (int)uVar77) * uVar77;
                    uVar79 = ((int)uVar63 < (int)uVar79) * uVar63 |
                             ((int)uVar63 >= (int)uVar79) * uVar79;
                    uVar81 = ((int)uVar64 < (int)uVar81) * uVar64 |
                             ((int)uVar64 >= (int)uVar81) * uVar81;
                    uVar14 = ((int)uVar14 < (int)uVar61) * uVar61 |
                             ((int)uVar14 >= (int)uVar61) * uVar14;
                    uVar25 = ((int)uVar25 < (int)uVar62) * uVar62 |
                             ((int)uVar25 >= (int)uVar62) * uVar25;
                    uVar71 = ((int)uVar71 < (int)uVar63) * uVar63 |
                             ((int)uVar71 >= (int)uVar63) * uVar71;
                    uVar72 = ((int)uVar72 < (int)uVar64) * uVar64 |
                             ((int)uVar72 >= (int)uVar64) * uVar72;
                    uVar14 = (uint)((int)uVar14 < iVar45) * iVar45 |
                             ((int)uVar14 >= iVar45) * uVar14;
                    iVar45 = auVar38._4_4_;
                    uVar25 = (uint)((int)uVar25 < iVar45) * iVar45 |
                             ((int)uVar25 >= iVar45) * uVar25;
                    iVar45 = auVar38._8_4_;
                    uVar71 = (uint)((int)uVar71 < iVar45) * iVar45 |
                             ((int)uVar71 >= iVar45) * uVar71;
                    iVar45 = auVar38._12_4_;
                    uVar72 = (uint)((int)uVar72 < iVar45) * iVar45 |
                             ((int)uVar72 >= iVar45) * uVar72;
                    uVar65 = (uint)(iVar30 < iVar48) * iVar48 | (uint)(iVar30 >= iVar48) * iVar30;
                    iVar45 = auVar96._4_4_;
                    iVar30 = auVar69._4_4_;
                    uVar66 = (uint)(iVar30 < iVar45) * iVar45 | (uint)(iVar30 >= iVar45) * iVar30;
                    iVar45 = auVar96._8_4_;
                    iVar30 = auVar69._8_4_;
                    iVar48 = auVar69._12_4_;
                    uVar67 = (uint)(iVar30 < iVar45) * iVar45 | (uint)(iVar30 >= iVar45) * iVar30;
                    iVar45 = auVar96._12_4_;
                    uVar73 = (uint)(iVar48 < iVar45) * iVar45 | (uint)(iVar48 >= iVar45) * iVar48;
                    uVar14 = ((int)uVar65 < (int)uVar14) * uVar14 |
                             ((int)uVar65 >= (int)uVar14) * uVar65;
                    uVar25 = ((int)uVar66 < (int)uVar25) * uVar25 |
                             ((int)uVar66 >= (int)uVar25) * uVar66;
                    uVar71 = ((int)uVar67 < (int)uVar71) * uVar71 |
                             ((int)uVar67 >= (int)uVar71) * uVar67;
                    uVar72 = ((int)uVar73 < (int)uVar72) * uVar72 |
                             ((int)uVar73 >= (int)uVar72) * uVar73;
                    lVar26 = lVar26 + 0x10;
                    lVar16 = lVar16 + uVar34 * 4;
                  } while (lVar29 != lVar26);
                  local_190 = local_190 + 4;
                } while (uVar27 != uVar20);
                iVar45 = uVar33 * 0x10;
                uVar34 = ptr[uVar33][0];
                uVar36 = ptr[uVar33][1];
                uVar20 = b_03[uVar33][0];
                uVar27 = b_03[uVar33][1];
                uVar87 = b_04[uVar33][0];
                uVar44 = b_04[uVar33][1];
                uVar37 = b_05[uVar33][0];
                uVar41 = b_05[uVar33][1];
                if (iVar28 / iVar35 < 3) {
                  iVar45 = 1;
                  if (1 < iVar12) {
                    iVar45 = iVar12;
                  }
                  do {
                    uVar36 = uVar36 << 0x20 | uVar34 >> 0x20;
                    uVar27 = uVar27 << 0x20 | uVar20 >> 0x20;
                    uVar44 = uVar44 << 0x20 | uVar87 >> 0x20;
                    uVar41 = uVar41 << 0x20 | uVar37 >> 0x20;
                    iVar45 = iVar45 + -1;
                    uVar34 = uVar34 << 0x20;
                    uVar20 = uVar20 << 0x20;
                    uVar87 = uVar87 << 0x20;
                    uVar37 = uVar37 << 0x20;
                  } while (iVar45 != 0);
                }
                auVar60._0_4_ = -(uint)((int)uVar75 < (int)uVar18);
                auVar60._4_4_ = -(uint)((int)uVar77 < (int)uVar18);
                auVar60._8_4_ = -(uint)((int)uVar79 < (int)uVar18);
                auVar60._12_4_ = -(uint)((int)uVar81 < (int)uVar18);
                auVar70._0_4_ = -(uint)((int)uVar10 < (int)uVar14);
                auVar70._4_4_ = -(uint)((int)uVar10 < (int)uVar25);
                auVar70._8_4_ = -(uint)((int)uVar10 < (int)uVar71);
                auVar70._12_4_ = -(uint)((int)uVar10 < (int)uVar72);
                iVar45 = movmskps(iVar45,auVar70 | auVar60);
                if (iVar45 == 0) {
                  iVar45 = (int)(uVar36 >> 0x20);
                  iVar30 = (int)(uVar27 >> 0x20);
                  iVar35 = (int)(uVar44 >> 0x20);
                  iVar48 = (int)(uVar41 >> 0x20);
                }
                else {
                  *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                  iVar45 = 0;
                  iVar30 = 0;
                  iVar35 = 0;
                  iVar48 = 0;
                  iVar11 = 0;
                  iVar28 = 0;
                }
                ppVar15->score = iVar45;
                ppVar15->end_query = iVar28;
                ppVar15->end_ref = iVar11;
                ((ppVar15->field_4).stats)->matches = iVar30;
                ((ppVar15->field_4).stats)->similar = iVar35;
                ((ppVar15->field_4).stats)->length = iVar48;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar15;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}